

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huffman_test.cpp
# Opt level: O3

void __thiscall HuffmanTest::test_read_buf(HuffmanTest *this,int number)

{
  bool bVar1;
  uint uVar2;
  size_t length;
  BitReader in;
  stringstream os;
  uint local_1a4;
  BitReader local_1a0;
  stringstream local_190 [16];
  char local_180 [112];
  ios_base local_110 [264];
  
  local_1a4 = number;
  std::__cxx11::stringstream::stringstream(local_190);
  BitReader::BitReader(&local_1a0,(istream *)local_190);
  std::ostream::write(local_180,(long)&local_1a4);
  length = 0;
  uVar2 = local_1a4;
  if (local_1a4 != 0) {
    do {
      length = length + 1;
      bVar1 = 1 < uVar2;
      uVar2 = (int)uVar2 >> 1;
    } while (bVar1);
  }
  uVar2 = BitReader::read_buf(&local_1a0,length);
  Test::check(uVar2 == local_1a4,"test_read_buf",
              "/workspace/llm4binary/github/license_all_cmakelists_25/jeinygroove[P]Huffman-Archiver/test/huffman_test.cpp"
              ,0x35);
  std::__cxx11::stringstream::~stringstream(local_190);
  std::ios_base::~ios_base(local_110);
  return;
}

Assistant:

void HuffmanTest::test_read_buf(int number) {
    std::stringstream os;
    BitReader in(os);
    os.write(reinterpret_cast<const char *>(&number), sizeof(int));
    int res = in.read_buf(count_size(number));
    DO_CHECK(res == number);
}